

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scp_dev.cpp
# Opt level: O0

string * VersionString_abi_cxx11_(string *__return_storage_ptr__,int version)

{
  ostream *poVar1;
  stringstream local_1a0 [8];
  stringstream ss;
  undefined1 local_190 [380];
  uint local_14;
  string *psStack_10;
  int version_local;
  
  local_14 = version;
  psStack_10 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  if (local_14 != 0) {
    poVar1 = (ostream *)std::ostream::operator<<(local_190,(int)local_14 >> 4);
    poVar1 = std::operator<<(poVar1,".");
    std::ostream::operator<<(poVar1,local_14 & 0xf);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

static std::string VersionString(int version)
{
    std::stringstream ss;
    if (version)
        ss << (version >> 4) << "." << (version & 0xf);
    return ss.str();
}